

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

MockSpec<test_result_(fmt::v5::monostate)> * __thiscall
testing::internal::FunctionMocker<test_result_(fmt::v5::monostate)>::With
          (FunctionMocker<test_result_(fmt::v5::monostate)> *this,Matcher<fmt::v5::monostate> *m1)

{
  MatcherBase<fmt::v5::monostate> local_20;
  
  Matcher<fmt::v5::monostate>::Matcher((Matcher<fmt::v5::monostate> *)&local_20,m1);
  linked_ptr<const_testing::MatcherInterface<fmt::v5::monostate>_>::operator=
            (&(this->super_FunctionMockerBase<test_result_(fmt::v5::monostate)>).current_spec_.
              matchers_.f0_.super_MatcherBase<fmt::v5::monostate>.impl_,&local_20.impl_);
  MatcherBase<fmt::v5::monostate>::~MatcherBase(&local_20);
  return &(this->super_FunctionMockerBase<test_result_(fmt::v5::monostate)>).current_spec_;
}

Assistant:

MockSpec<F>& With(const Matcher<A1>& m1) {
    this->current_spec().SetMatchers(::std::tr1::make_tuple(m1));
    return this->current_spec();
  }